

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::MembraneHook::whenMoreResolved(MembraneHook *this)

{
  long lVar1;
  OwnPromiseNode OVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> node;
  ClientHook *pCVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  aVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_03;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar5;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> _promise503;
  NullableValue<kj::Promise<void>_> _r504;
  void *continuationTracePtr;
  anon_class_1_0_00000001_for_func local_81;
  char local_80;
  OwnPromiseNode local_78;
  PromiseDisposer local_70;
  undefined7 uStack_6f;
  OwnPromiseNode local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  SourceLocation local_58;
  anon_class_8_1_8991fb9c_for_func local_40;
  Own<capnp::ClientHook,_std::nullptr_t> local_38;
  
  lVar1 = *(long *)(in_RSI + 0x50);
  if (lVar1 != 0) {
    (**(code **)(**(long **)(in_RSI + 0x50) + 0x20))(&local_38);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<capnp::ClientHook,decltype(nullptr)>>
              ((PromiseDisposer *)&local_58,&local_38);
    pCVar3 = local_38.ptr;
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    (this->super_ClientHook).brand = local_58.fileName;
    aVar4 = extraout_RDX;
    if (local_38.ptr != (ClientHook *)0x0) {
      local_38.ptr = (ClientHook *)0x0;
      (**(local_38.disposer)->_vptr_Disposer)
                (local_38.disposer,
                 (_func_int *)((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2])
                );
      aVar4 = extraout_RDX_00;
    }
    if (lVar1 != 0) goto LAB_00324987;
  }
  (**(code **)(**(long **)(in_RSI + 0x28) + 0x18))(&local_58);
  local_80 = (char)local_58.fileName._0_1_;
  if (local_58.fileName._0_1_ == (PromiseDisposer)0x1) {
    local_78.ptr = (PromiseNode *)local_58.function;
    local_58.function = (char *)0x0;
    (**(code **)(**(long **)(in_RSI + 0x38) + 0x18))(&local_58);
    local_70 = local_58.fileName._0_1_;
    if (local_58.fileName._0_1_ == (PromiseDisposer)0x1) {
      local_68.ptr = (PromiseNode *)local_58.function;
      local_58.function = (char *)0x0;
    }
    if (local_58.fileName._0_1_ == (PromiseDisposer)0x1) {
      local_58.fileName =
           (char *)kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++:505:48)>
                   ::anon_class_1_0_00000001_for_func::operator();
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::MembraneHook::whenMoreResolved()::_lambda()_1_>,kj::_::PromiseDisposer,capnp::MembraneHook::whenMoreResolved()::_lambda()_1_,void*&>
                ((PromiseDisposer *)&local_40,&local_68,&local_81,&local_58.fileName);
      local_60.ptr = (PromiseNode *)local_40.this;
      local_58.fileName =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
      ;
      local_58.function = "whenMoreResolved";
      local_58.lineNumber = 0x1f9;
      local_58.columnNumber = 0x13;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
                ((PromiseDisposer *)&local_40,&local_78,&local_60,&local_58);
      OVar2.ptr = local_78.ptr;
      local_78.ptr = (PromiseNode *)local_40.this;
      if (&(OVar2.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
      node.ptr = local_60.ptr;
      if (&(local_60.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_60.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
      }
    }
    OVar2.ptr = local_68.ptr;
    if ((local_70 == (PromiseDisposer)0x1) &&
       (&(local_68.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0)) {
      local_68.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
    local_58.fileName =
         (char *)kj::_::
                 SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++:510:27)>
                 ::anon_class_8_1_8991fb9c_for_func::operator();
    kj::_::PromiseDisposer::
    appendPromise<kj::_::SimpleTransformPromiseNode<kj::Own<capnp::ClientHook,decltype(nullptr)>,capnp::MembraneHook::whenMoreResolved()::_lambda(kj::Own<capnp::ClientHook,decltype(nullptr)>&&)_1_>,kj::_::PromiseDisposer,capnp::MembraneHook::whenMoreResolved()::_lambda(kj::Own<capnp::ClientHook,decltype(nullptr)>&&)_1_,void*&>
              (&local_70,&local_78,&local_40,&local_58.fileName);
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    (this->super_ClientHook).brand = (void *)CONCAT71(uStack_6f,local_70);
    aVar4 = extraout_RDX_02;
  }
  else {
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
    aVar4 = extraout_RDX_01;
  }
  OVar2.ptr = local_78.ptr;
  if ((local_80 == '\x01') &&
     (&(local_78.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0)) {
    local_78.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    aVar4 = extraout_RDX_03;
  }
LAB_00324987:
  MVar5.ptr.field_1 = aVar4;
  MVar5.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar5.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r.get()->addRef());
    }

    KJ_IF_SOME(promise, inner->whenMoreResolved()) {
      KJ_IF_SOME(r, policy->onRevoked()) {
        promise = promise.exclusiveJoin(r.then([]() -> kj::Own<ClientHook> {
          KJ_FAIL_REQUIRE("onRevoked() promise resolved; it should only reject");
        }));
      }

      return promise.then([this](kj::Own<ClientHook>&& newInner) {
        // There's a chance resolved was set by getResolved() or a concurrent whenMoreResolved()
        // while we yielded the event loop. If the inner ClientHook is maintaining the contract,
        // then resolved would already be set to newInner after wrapping in a MembraneHook.
        KJ_IF_SOME(r, resolved) {
          return r->addRef();
        } else {
          return resolved.emplace(wrap(*newInner, *policy, reverse))->addRef();
        }
      });
    } else {
      return kj::none;
    }
  }